

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[18],char_const*,char[21],unsigned_int,char[57],char_const*,char[20],unsigned_int,char>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [18],char **RestArgs,char (*RestArgs_1) [21],uint *RestArgs_2,
               char (*RestArgs_3) [57],char **RestArgs_4,char (*RestArgs_5) [20],uint *RestArgs_6,
               char *RestArgs_7)

{
  char (*RestArgs_local_3) [57];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [21];
  char **RestArgs_local;
  char (*FirstArg_local) [18];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[18]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[21],unsigned_int,char[57],char_const*,char[20],unsigned_int,char>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}